

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  BVH *bvh;
  NodeRef root;
  Scene *pSVar2;
  float *pfVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  float fVar6;
  float fVar7;
  size_t k;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uint uVar17;
  int iVar18;
  undefined4 uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar26;
  long lVar27;
  NodeRef *pNVar28;
  bool bVar29;
  vint4 ai_2;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar38;
  undefined1 in_ZMM0 [64];
  vint4 ai;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  vint4 bi_3;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  float fVar57;
  float fVar58;
  vint4 bi_2;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar59;
  vint4 bi_1;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  vint4 ai_1;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  vint4 ai_3;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  vint4 bi;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [64];
  uint uVar96;
  undefined1 auVar97 [16];
  uint uVar99;
  uint uVar100;
  uint uVar101;
  undefined1 auVar98 [64];
  undefined1 auVar102 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar103;
  undefined1 auVar104 [16];
  undefined1 auVar105 [64];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  Precalculations pre;
  undefined1 local_1a28 [16];
  undefined1 local_1a08 [8];
  float fStack_1a00;
  float fStack_19fc;
  undefined1 local_19d8 [16];
  RayK<4> *local_19c0;
  undefined1 local_19b8 [16];
  undefined1 local_19a8 [8];
  float fStack_19a0;
  float fStack_199c;
  vbool<4> terminated;
  RTCFilterFunctionNArguments args;
  RTCHitN local_1918 [16];
  undefined1 local_1908 [16];
  undefined1 local_18f8 [16];
  undefined1 local_18e8 [16];
  undefined1 local_18d8 [16];
  undefined1 local_18c8 [16];
  undefined1 local_18b8 [16];
  uint local_18a8;
  uint uStack_18a4;
  uint uStack_18a0;
  uint uStack_189c;
  uint uStack_1898;
  uint uStack_1894;
  uint uStack_1890;
  uint uStack_188c;
  undefined1 local_1888 [16];
  undefined8 local_1878;
  undefined8 uStack_1870;
  undefined1 local_1868 [16];
  undefined1 local_1858 [16];
  float local_1848;
  float fStack_1844;
  float fStack_1840;
  float fStack_183c;
  undefined1 local_1838 [16];
  float local_1828;
  float fStack_1824;
  float fStack_1820;
  float fStack_181c;
  float local_1818;
  float fStack_1814;
  float fStack_1810;
  float fStack_180c;
  float local_1808;
  float fStack_1804;
  float fStack_1800;
  float fStack_17fc;
  float local_17f8;
  float fStack_17f4;
  float fStack_17f0;
  float fStack_17ec;
  TravRayK<4,_false> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar51 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar83 = vpcmpeqd_avx(auVar51,(undefined1  [16])valid_i->field_0);
    auVar30 = ZEXT816(0) << 0x40;
    auVar53 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar30,5);
    auVar37 = auVar83 & auVar53;
    if ((((auVar37 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar37 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar37 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar37[0xf] < '\0')
    {
      local_1868 = vandps_avx(auVar53,auVar83);
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar102._8_4_ = 0x7fffffff;
      auVar102._0_8_ = 0x7fffffff7fffffff;
      auVar102._12_4_ = 0x7fffffff;
      auVar53 = vandps_avx(auVar102,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar92._8_4_ = 0x219392ef;
      auVar92._0_8_ = 0x219392ef219392ef;
      auVar92._12_4_ = 0x219392ef;
      auVar53 = vcmpps_avx(auVar53,auVar92,1);
      auVar83 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar92,auVar53);
      auVar53 = vandps_avx(auVar102,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar53 = vcmpps_avx(auVar53,auVar92,1);
      auVar37 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar92,auVar53);
      auVar53 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar102);
      auVar53 = vcmpps_avx(auVar53,auVar92,1);
      auVar53 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar92,auVar53);
      auVar67 = vrcpps_avx(auVar83);
      auVar93._8_4_ = 0x3f800000;
      auVar93._0_8_ = &DAT_3f8000003f800000;
      auVar93._12_4_ = 0x3f800000;
      auVar83 = vfnmadd213ps_fma(auVar83,auVar67,auVar93);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar83,auVar67,auVar67)
      ;
      auVar83 = vrcpps_avx(auVar37);
      auVar37 = vfnmadd213ps_fma(auVar37,auVar83,auVar93);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar37,auVar83,auVar83)
      ;
      auVar83 = vrcpps_avx(auVar53);
      auVar53 = vfnmadd213ps_fma(auVar53,auVar83,auVar93);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar53,auVar83,auVar83)
      ;
      tray.org_rdir.field_0._0_4_ = tray.rdir.field_0._0_4_ * (float)tray.org.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = tray.rdir.field_0._4_4_ * (float)tray.org.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = tray.rdir.field_0._8_4_ * (float)tray.org.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = tray.rdir.field_0._12_4_ * (float)tray.org.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      auVar53 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar30,1);
      auVar83._8_4_ = 0x10;
      auVar83._0_8_ = 0x1000000010;
      auVar83._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar53,auVar83);
      auVar53 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar30,5);
      auVar37._8_4_ = 0x20;
      auVar37._0_8_ = 0x2000000020;
      auVar37._12_4_ = 0x20;
      auVar67._8_4_ = 0x30;
      auVar67._0_8_ = 0x3000000030;
      auVar67._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar67,auVar37,auVar53);
      auVar53 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar30,5);
      auVar68._8_4_ = 0x40;
      auVar68._0_8_ = 0x4000000040;
      auVar68._12_4_ = 0x40;
      auVar73._8_4_ = 0x50;
      auVar73._0_8_ = 0x5000000050;
      auVar73._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar73,auVar68,auVar53);
      auVar53 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar30);
      auVar83 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar30);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar95 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar53,local_1868);
      auVar53._8_4_ = 0xff800000;
      auVar53._0_8_ = 0xff800000ff800000;
      auVar53._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar53,auVar83,local_1868);
      terminated.field_0.i[1] = local_1868._4_4_ ^ auVar51._4_4_;
      terminated.field_0.i[0] = local_1868._0_4_ ^ auVar51._0_4_;
      terminated.field_0.i[2] = local_1868._8_4_ ^ auVar51._8_4_;
      terminated.field_0.i[3] = local_1868._12_4_ ^ auVar51._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar25 = 3;
      }
      else {
        uVar25 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_19c0 = ray + 0x80;
      pNVar28 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar26 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      local_1878 = mm_lookupmask_ps._0_8_;
      uStack_1870 = mm_lookupmask_ps._8_8_;
      local_1888 = mm_lookupmask_ps._240_16_;
      auVar53 = vpcmpeqd_avx(local_1868,local_1868);
      auVar98 = ZEXT1664(auVar53);
LAB_005423d4:
      paVar26 = paVar26 + -1;
      root.ptr = pNVar28[-1].ptr;
      pNVar28 = pNVar28 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_005430fa;
      aVar103 = *paVar26;
      auVar53 = vcmpps_avx((undefined1  [16])aVar103,(undefined1  [16])tray.tfar.field_0,1);
      uVar17 = vmovmskps_avx(auVar53);
      if (uVar17 == 0) {
        iVar18 = 2;
      }
      else {
        uVar22 = (ulong)(uVar17 & 0xff);
        uVar17 = POPCOUNT(uVar17 & 0xff);
        iVar18 = 0;
        if (uVar17 <= uVar25) {
          do {
            k = 0;
            for (uVar20 = uVar22; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
              k = k + 1;
            }
            auVar98 = ZEXT1664(auVar98._0_16_);
            bVar29 = occluded1(This,bvh,root,k,&pre,ray,&tray,context);
            if (bVar29) {
              terminated.field_0.i[k] = -1;
            }
            uVar22 = uVar22 - 1 & uVar22;
          } while (uVar22 != 0);
          auVar53 = vpcmpeqd_avx(auVar98._0_16_,auVar98._0_16_);
          auVar98 = ZEXT1664(auVar53);
          auVar53 = auVar53 & ~(undefined1  [16])terminated.field_0;
          iVar18 = 3;
          auVar95 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar53 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar53[0xf] < '\0') {
            auVar51._8_4_ = 0xff800000;
            auVar51._0_8_ = 0xff800000ff800000;
            auVar51._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar51,
                               (undefined1  [16])terminated.field_0);
            iVar18 = 2;
          }
        }
        if (uVar25 < uVar17) {
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_005430fa;
              auVar53 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar103,6);
              if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar53 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar53[0xf] < '\0') {
                uVar22 = (ulong)((uint)root.ptr & 0xf);
                aVar38 = terminated.field_0;
                if (uVar22 == 8) goto LAB_005430b7;
                lVar27 = (root.ptr & 0xfffffffffffffff0) + 0x50;
                uVar20 = 0;
                auVar53 = auVar98._0_16_ ^ (undefined1  [16])terminated.field_0;
                goto LAB_005425ff;
              }
              iVar18 = 2;
              break;
            }
            auVar105 = ZEXT1664(auVar95._0_16_);
            uVar22 = 0;
            uVar20 = 8;
            do {
              uVar21 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar22 * 8);
              if (uVar21 != 8) {
                uVar19 = *(undefined4 *)(root.ptr + 0x20 + uVar22 * 4);
                auVar39._4_4_ = uVar19;
                auVar39._0_4_ = uVar19;
                auVar39._8_4_ = uVar19;
                auVar39._12_4_ = uVar19;
                auVar14._4_4_ = tray.org_rdir.field_0._4_4_;
                auVar14._0_4_ = tray.org_rdir.field_0._0_4_;
                auVar14._8_4_ = tray.org_rdir.field_0._8_4_;
                auVar14._12_4_ = tray.org_rdir.field_0._12_4_;
                auVar83 = vfmsub213ps_fma(auVar39,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.x.field_0,auVar14);
                uVar19 = *(undefined4 *)(root.ptr + 0x40 + uVar22 * 4);
                auVar69._4_4_ = uVar19;
                auVar69._0_4_ = uVar19;
                auVar69._8_4_ = uVar19;
                auVar69._12_4_ = uVar19;
                auVar15._4_4_ = tray.org_rdir.field_0._20_4_;
                auVar15._0_4_ = tray.org_rdir.field_0._16_4_;
                auVar15._8_4_ = tray.org_rdir.field_0._24_4_;
                auVar15._12_4_ = tray.org_rdir.field_0._28_4_;
                auVar37 = vfmsub213ps_fma(auVar69,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.y.field_0,auVar15);
                uVar19 = *(undefined4 *)(root.ptr + 0x60 + uVar22 * 4);
                auVar77._4_4_ = uVar19;
                auVar77._0_4_ = uVar19;
                auVar77._8_4_ = uVar19;
                auVar77._12_4_ = uVar19;
                auVar16._4_4_ = tray.org_rdir.field_0._36_4_;
                auVar16._0_4_ = tray.org_rdir.field_0._32_4_;
                auVar16._8_4_ = tray.org_rdir.field_0._40_4_;
                auVar16._12_4_ = tray.org_rdir.field_0._44_4_;
                auVar30 = vfmsub213ps_fma(auVar77,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.z.field_0,auVar16);
                uVar19 = *(undefined4 *)(root.ptr + 0x30 + uVar22 * 4);
                auVar88._4_4_ = uVar19;
                auVar88._0_4_ = uVar19;
                auVar88._8_4_ = uVar19;
                auVar88._12_4_ = uVar19;
                auVar67 = vfmsub213ps_fma(auVar88,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.x.field_0,auVar14);
                uVar19 = *(undefined4 *)(root.ptr + 0x50 + uVar22 * 4);
                auVar60._4_4_ = uVar19;
                auVar60._0_4_ = uVar19;
                auVar60._8_4_ = uVar19;
                auVar60._12_4_ = uVar19;
                auVar68 = vfmsub213ps_fma(auVar60,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.y.field_0,auVar15);
                uVar19 = *(undefined4 *)(root.ptr + 0x70 + uVar22 * 4);
                auVar45._4_4_ = uVar19;
                auVar45._0_4_ = uVar19;
                auVar45._8_4_ = uVar19;
                auVar45._12_4_ = uVar19;
                auVar73 = vfmsub213ps_fma(auVar45,(undefined1  [16])
                                                  tray.rdir.field_0.field_0.z.field_0,auVar16);
                auVar53 = vpminsd_avx(auVar83,auVar67);
                auVar51 = vpminsd_avx(auVar37,auVar68);
                auVar53 = vpmaxsd_avx(auVar53,auVar51);
                auVar51 = vpminsd_avx(auVar30,auVar73);
                auVar51 = vpmaxsd_avx(auVar53,auVar51);
                auVar53 = vpmaxsd_avx(auVar83,auVar67);
                auVar83 = vpmaxsd_avx(auVar37,auVar68);
                auVar83 = vpminsd_avx(auVar53,auVar83);
                auVar53 = vpmaxsd_avx(auVar30,auVar73);
                auVar83 = vpminsd_avx(auVar83,auVar53);
                auVar53 = vpmaxsd_avx(auVar51,(undefined1  [16])tray.tnear.field_0);
                auVar83 = vpminsd_avx(auVar83,(undefined1  [16])tray.tfar.field_0);
                auVar53 = vcmpps_avx(auVar53,auVar83,2);
                if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar53 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar53[0xf] < '\0') {
                  auVar53 = vblendvps_avx(auVar95._0_16_,auVar51,auVar53);
                  if (uVar20 != 8) {
                    pNVar28->ptr = uVar20;
                    pNVar28 = pNVar28 + 1;
                    *paVar26 = auVar105._0_16_;
                    paVar26 = paVar26 + 1;
                  }
                  auVar105 = ZEXT1664(auVar53);
                  uVar20 = uVar21;
                }
              }
              aVar103 = auVar105._0_16_;
            } while ((uVar21 != 8) && (bVar29 = uVar22 < 3, uVar22 = uVar22 + 1, bVar29));
            iVar18 = 0;
            if (uVar20 == 8) {
LAB_005425a7:
              bVar29 = false;
              iVar18 = 4;
            }
            else {
              auVar53 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar103,6);
              uVar19 = vmovmskps_avx(auVar53);
              bVar29 = true;
              if ((uint)POPCOUNT(uVar19) <= uVar25) {
                pNVar28->ptr = uVar20;
                pNVar28 = pNVar28 + 1;
                *paVar26 = aVar103;
                paVar26 = paVar26 + 1;
                goto LAB_005425a7;
              }
            }
            root.ptr = uVar20;
          } while (bVar29);
        }
      }
      goto LAB_005430fd;
    }
  }
  return;
  while( true ) {
    uVar20 = uVar20 + 1;
    lVar27 = lVar27 + 0x60;
    auVar53 = auVar51;
    if (uVar22 - 8 <= uVar20) break;
LAB_005425ff:
    pSVar2 = context->scene;
    uVar21 = 0;
    local_1a28 = auVar53;
    while (iVar18 = *(int *)(lVar27 + uVar21 * 4), iVar18 != -1) {
      uVar17 = *(uint *)(lVar27 + -0x10 + uVar21 * 4);
      pfVar3 = (pSVar2->vertices).items[uVar17];
      uVar24 = (ulong)*(uint *)(lVar27 + -0x50 + uVar21 * 4);
      uVar23 = (ulong)*(uint *)(lVar27 + -0x40 + uVar21 * 4);
      fVar52 = pfVar3[uVar24];
      auVar74._4_4_ = fVar52;
      auVar74._0_4_ = fVar52;
      auVar74._8_4_ = fVar52;
      auVar74._12_4_ = fVar52;
      fVar57 = pfVar3[uVar24 + 1];
      auVar78._4_4_ = fVar57;
      auVar78._0_4_ = fVar57;
      auVar78._8_4_ = fVar57;
      auVar78._12_4_ = fVar57;
      fVar58 = pfVar3[uVar24 + 2];
      auVar84._4_4_ = fVar58;
      auVar84._0_4_ = fVar58;
      auVar84._8_4_ = fVar58;
      auVar84._12_4_ = fVar58;
      local_1a08._4_4_ = pfVar3[uVar23];
      local_19a8._4_4_ = pfVar3[uVar23 + 1];
      local_17f8 = pfVar3[uVar23 + 2];
      uVar23 = (ulong)*(uint *)(lVar27 + -0x20 + uVar21 * 4);
      local_1808 = pfVar3[uVar23];
      local_1818 = pfVar3[uVar23 + 1];
      local_1828 = pfVar3[uVar23 + 2];
      local_1a08._0_4_ = local_1a08._4_4_;
      fStack_1a00 = (float)local_1a08._4_4_;
      fStack_19fc = (float)local_1a08._4_4_;
      fVar59 = fVar52 - (float)local_1a08._4_4_;
      auVar61._4_4_ = fVar59;
      auVar61._0_4_ = fVar59;
      auVar61._8_4_ = fVar59;
      auVar61._12_4_ = fVar59;
      local_19a8._0_4_ = local_19a8._4_4_;
      fStack_19a0 = (float)local_19a8._4_4_;
      fStack_199c = (float)local_19a8._4_4_;
      fVar6 = fVar57 - (float)local_19a8._4_4_;
      fVar7 = fVar58 - local_17f8;
      auVar106._4_4_ = fVar7;
      auVar106._0_4_ = fVar7;
      auVar106._8_4_ = fVar7;
      auVar106._12_4_ = fVar7;
      fVar52 = local_1808 - fVar52;
      auVar70._4_4_ = fVar52;
      auVar70._0_4_ = fVar52;
      auVar70._8_4_ = fVar52;
      auVar70._12_4_ = fVar52;
      fVar52 = fVar52 * fVar7;
      fVar57 = local_1818 - fVar57;
      fVar59 = fVar57 * fVar59;
      auVar97._4_4_ = fVar57;
      auVar97._0_4_ = fVar57;
      auVar97._8_4_ = fVar57;
      auVar97._12_4_ = fVar57;
      auVar89._4_4_ = fVar6;
      auVar89._0_4_ = fVar6;
      auVar89._8_4_ = fVar6;
      auVar89._12_4_ = fVar6;
      fVar58 = local_1828 - fVar58;
      fVar6 = fVar6 * fVar58;
      auVar104._4_4_ = fVar58;
      auVar104._0_4_ = fVar58;
      auVar104._8_4_ = fVar58;
      auVar104._12_4_ = fVar58;
      auVar30._4_4_ = fVar6;
      auVar30._0_4_ = fVar6;
      auVar30._8_4_ = fVar6;
      auVar30._12_4_ = fVar6;
      auVar92 = vfmsub231ps_fma(auVar30,auVar97,auVar106);
      auVar40._4_4_ = fVar52;
      auVar40._0_4_ = fVar52;
      auVar40._8_4_ = fVar52;
      auVar40._12_4_ = fVar52;
      auVar93 = vfmsub231ps_fma(auVar40,auVar104,auVar61);
      auVar46._4_4_ = fVar59;
      auVar46._0_4_ = fVar59;
      auVar46._8_4_ = fVar59;
      auVar46._12_4_ = fVar59;
      auVar30 = vsubps_avx(auVar74,*(undefined1 (*) [16])ray);
      auVar67 = vsubps_avx(auVar78,*(undefined1 (*) [16])(ray + 0x10));
      auVar40 = vfmsub231ps_fma(auVar46,auVar70,auVar89);
      auVar68 = vsubps_avx(auVar84,*(undefined1 (*) [16])(ray + 0x20));
      auVar51 = *(undefined1 (*) [16])(ray + 0x40);
      auVar83 = *(undefined1 (*) [16])(ray + 0x50);
      auVar107._0_4_ = auVar51._0_4_ * auVar67._0_4_;
      auVar107._4_4_ = auVar51._4_4_ * auVar67._4_4_;
      auVar107._8_4_ = auVar51._8_4_ * auVar67._8_4_;
      auVar107._12_4_ = auVar51._12_4_ * auVar67._12_4_;
      auVar46 = vfmsub231ps_fma(auVar107,auVar30,auVar83);
      auVar37 = *(undefined1 (*) [16])(ray + 0x60);
      auVar85._0_4_ = auVar37._0_4_ * auVar40._0_4_;
      auVar85._4_4_ = auVar37._4_4_ * auVar40._4_4_;
      auVar85._8_4_ = auVar37._8_4_ * auVar40._8_4_;
      auVar85._12_4_ = auVar37._12_4_ * auVar40._12_4_;
      auVar73 = vfmadd231ps_fma(auVar85,auVar93,auVar83);
      auVar109._0_4_ = auVar83._0_4_ * auVar68._0_4_;
      auVar109._4_4_ = auVar83._4_4_ * auVar68._4_4_;
      auVar109._8_4_ = auVar83._8_4_ * auVar68._8_4_;
      auVar109._12_4_ = auVar83._12_4_ * auVar68._12_4_;
      auVar74 = vfmsub231ps_fma(auVar109,auVar67,auVar37);
      auVar111._0_4_ = auVar37._0_4_ * auVar30._0_4_;
      auVar111._4_4_ = auVar37._4_4_ * auVar30._4_4_;
      auVar111._8_4_ = auVar37._8_4_ * auVar30._8_4_;
      auVar111._12_4_ = auVar37._12_4_ * auVar30._12_4_;
      auVar78 = vfmsub231ps_fma(auVar111,auVar68,auVar51);
      auVar73 = vfmadd231ps_fma(auVar73,auVar92,auVar51);
      auVar54._0_4_ = fVar58 * auVar46._0_4_;
      auVar54._4_4_ = fVar58 * auVar46._4_4_;
      auVar54._8_4_ = fVar58 * auVar46._8_4_;
      auVar54._12_4_ = fVar58 * auVar46._12_4_;
      auVar51 = vfmadd231ps_fma(auVar54,auVar78,auVar97);
      auVar83 = vfmadd231ps_fma(auVar51,auVar74,auVar70);
      local_1838._8_4_ = 0x80000000;
      local_1838._0_8_ = 0x8000000080000000;
      local_1838._12_4_ = 0x80000000;
      uVar23 = (ulong)*(uint *)(lVar27 + -0x30 + uVar21 * 4);
      auVar51 = vandps_avx(auVar73,local_1838);
      uVar96 = auVar51._0_4_;
      auVar90._0_4_ = (float)(uVar96 ^ auVar83._0_4_);
      uVar99 = auVar51._4_4_;
      auVar90._4_4_ = (float)(uVar99 ^ auVar83._4_4_);
      uVar100 = auVar51._8_4_;
      auVar90._8_4_ = (float)(uVar100 ^ auVar83._8_4_);
      uVar101 = auVar51._12_4_;
      auVar90._12_4_ = (float)(uVar101 ^ auVar83._12_4_);
      auVar83 = vcmpps_avx(auVar90,_DAT_01feba10,5);
      auVar37 = local_1a28 & auVar83;
      local_1848 = pfVar3[uVar23];
      fVar52 = pfVar3[uVar23 + 1];
      auVar62._4_4_ = fVar52;
      auVar62._0_4_ = fVar52;
      auVar62._8_4_ = fVar52;
      auVar62._12_4_ = fVar52;
      fVar52 = pfVar3[uVar23 + 2];
      local_1858._4_4_ = fVar52;
      local_1858._0_4_ = fVar52;
      local_1858._8_4_ = fVar52;
      local_1858._12_4_ = fVar52;
      fStack_1844 = local_1848;
      fStack_1840 = local_1848;
      fStack_183c = local_1848;
      fStack_1824 = local_1828;
      fStack_1820 = local_1828;
      fStack_181c = local_1828;
      fStack_1814 = local_1818;
      fStack_1810 = local_1818;
      fStack_180c = local_1818;
      fStack_1804 = local_1808;
      fStack_1800 = local_1808;
      fStack_17fc = local_1808;
      fStack_17f4 = local_17f8;
      fStack_17f0 = local_17f8;
      fStack_17ec = local_17f8;
      if ((((auVar37 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar37 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar37 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar37[0xf] < '\0'
         ) {
        auVar83 = vandps_avx(auVar83,local_1a28);
        auVar56._0_4_ = auVar46._0_4_ * fVar7;
        auVar56._4_4_ = auVar46._4_4_ * fVar7;
        auVar56._8_4_ = auVar46._8_4_ * fVar7;
        auVar56._12_4_ = auVar46._12_4_ * fVar7;
        auVar37 = vfmadd213ps_fma(auVar89,auVar78,auVar56);
        auVar37 = vfmadd213ps_fma(auVar61,auVar74,auVar37);
        auVar91._0_4_ = (float)(uVar96 ^ auVar37._0_4_);
        auVar91._4_4_ = (float)(uVar99 ^ auVar37._4_4_);
        auVar91._8_4_ = (float)(uVar100 ^ auVar37._8_4_);
        auVar91._12_4_ = (float)(uVar101 ^ auVar37._12_4_);
        auVar37 = vcmpps_avx(auVar91,_DAT_01feba10,5);
        auVar46 = auVar83 & auVar37;
        local_19b8 = auVar62;
        if ((((auVar46 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar46 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar46 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar46[0xf] < '\0') {
          auVar46 = vandps_avx(auVar73,auVar102);
          auVar83 = vandps_avx(auVar83,auVar37);
          auVar37 = vsubps_avx(auVar46,auVar90);
          auVar37 = vcmpps_avx(auVar37,auVar91,5);
          auVar74 = auVar83 & auVar37;
          if ((((auVar74 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar74 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar74 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar74[0xf] < '\0') {
            auVar83 = vandps_avx(auVar37,auVar83);
            auVar64._0_4_ = auVar68._0_4_ * auVar40._0_4_;
            auVar64._4_4_ = auVar68._4_4_ * auVar40._4_4_;
            auVar64._8_4_ = auVar68._8_4_ * auVar40._8_4_;
            auVar64._12_4_ = auVar68._12_4_ * auVar40._12_4_;
            auVar37 = vfmadd213ps_fma(auVar67,auVar93,auVar64);
            auVar37 = vfmadd213ps_fma(auVar30,auVar92,auVar37);
            auVar65._0_4_ = (float)(uVar96 ^ auVar37._0_4_);
            auVar65._4_4_ = (float)(uVar99 ^ auVar37._4_4_);
            auVar65._8_4_ = (float)(uVar100 ^ auVar37._8_4_);
            auVar65._12_4_ = (float)(uVar101 ^ auVar37._12_4_);
            auVar76._0_4_ = auVar46._0_4_ * *(float *)(ray + 0x30);
            auVar76._4_4_ = auVar46._4_4_ * *(float *)(ray + 0x34);
            auVar76._8_4_ = auVar46._8_4_ * *(float *)(ray + 0x38);
            auVar76._12_4_ = auVar46._12_4_ * *(float *)(ray + 0x3c);
            auVar37 = vcmpps_avx(auVar76,auVar65,1);
            pRVar1 = ray + 0x80;
            auVar67 = *(undefined1 (*) [16])pRVar1;
            auVar79._0_4_ = auVar46._0_4_ * *(float *)pRVar1;
            auVar79._4_4_ = auVar46._4_4_ * *(float *)(ray + 0x84);
            auVar79._8_4_ = auVar46._8_4_ * *(float *)(ray + 0x88);
            auVar79._12_4_ = auVar46._12_4_ * *(float *)(ray + 0x8c);
            auVar30 = vcmpps_avx(auVar65,auVar79,2);
            auVar37 = vandps_avx(auVar30,auVar37);
            auVar30 = auVar83 & auVar37;
            if ((((auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar30[0xf] < '\0') {
              auVar83 = vandps_avx(auVar83,auVar37);
              auVar37 = vcmpps_avx(auVar73,_DAT_01feba10,4);
              auVar30 = auVar83 & auVar37;
              if ((((auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar30[0xf] < '\0') {
                auVar83 = vandps_avx(auVar37,auVar83);
                pGVar4 = (context->scene->geometries).items[uVar17].ptr;
                uVar96 = pGVar4->mask;
                auVar80._4_4_ = uVar96;
                auVar80._0_4_ = uVar96;
                auVar80._8_4_ = uVar96;
                auVar80._12_4_ = uVar96;
                auVar37 = vpand_avx(auVar80,*(undefined1 (*) [16])(ray + 0x90));
                auVar37 = vpcmpeqd_avx(auVar37,_DAT_01feba10);
                auVar30 = auVar83 & ~auVar37;
                if ((((auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar30[0xf] < '\0') {
                  auVar83 = vandnps_avx(auVar37,auVar83);
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar37 = vrcpps_avx(auVar46);
                    auVar94._8_4_ = 0x3f800000;
                    auVar94._0_8_ = &DAT_3f8000003f800000;
                    auVar94._12_4_ = 0x3f800000;
                    auVar30 = vfnmadd213ps_fma(auVar46,auVar37,auVar94);
                    auVar37 = vfmadd132ps_fma(auVar30,auVar37,auVar37);
                    fVar52 = auVar37._0_4_;
                    auVar72._0_4_ = fVar52 * auVar90._0_4_;
                    fVar57 = auVar37._4_4_;
                    auVar72._4_4_ = fVar57 * auVar90._4_4_;
                    fVar58 = auVar37._8_4_;
                    auVar72._8_4_ = fVar58 * auVar90._8_4_;
                    fVar59 = auVar37._12_4_;
                    auVar72._12_4_ = fVar59 * auVar90._12_4_;
                    auVar37 = vminps_avx(auVar72,auVar94);
                    auVar82._0_4_ = auVar91._0_4_ * fVar52;
                    auVar82._4_4_ = auVar91._4_4_ * fVar57;
                    auVar82._8_4_ = auVar91._8_4_ * fVar58;
                    auVar82._12_4_ = auVar91._12_4_ * fVar59;
                    auVar30 = vminps_avx(auVar82,auVar94);
                    auVar68 = vsubps_avx(auVar94,auVar37);
                    auVar73 = vsubps_avx(auVar94,auVar30);
                    auVar8._8_8_ = uStack_1870;
                    auVar8._0_8_ = local_1878;
                    local_18e8 = vblendvps_avx(auVar37,auVar68,auVar8);
                    local_18d8 = vblendvps_avx(auVar30,auVar73,auVar8);
                    local_18b8._4_4_ = uVar17;
                    local_18b8._0_4_ = uVar17;
                    local_18b8._8_4_ = uVar17;
                    local_18b8._12_4_ = uVar17;
                    local_18c8._4_4_ = iVar18;
                    local_18c8._0_4_ = iVar18;
                    local_18c8._8_4_ = iVar18;
                    local_18c8._12_4_ = iVar18;
                    vpcmpeqd_avx2(ZEXT1632(auVar92),ZEXT1632(auVar92));
                    uStack_18a4 = context->user->instID[0];
                    local_18a8 = uStack_18a4;
                    uStack_18a0 = uStack_18a4;
                    uStack_189c = uStack_18a4;
                    uStack_1898 = context->user->instPrimID[0];
                    auVar42._0_4_ = fVar52 * auVar65._0_4_;
                    auVar42._4_4_ = fVar57 * auVar65._4_4_;
                    auVar42._8_4_ = fVar58 * auVar65._8_4_;
                    auVar42._12_4_ = fVar59 * auVar65._12_4_;
                    uStack_1894 = uStack_1898;
                    uStack_1890 = uStack_1898;
                    uStack_188c = uStack_1898;
                    auVar37 = vblendvps_avx(*(undefined1 (*) [16])pRVar1,auVar42,auVar83);
                    *(undefined1 (*) [16])(ray + 0x80) = auVar37;
                    args.valid = (int *)local_19d8;
                    args.geometryUserPtr = pGVar4->userPtr;
                    args.context = context->user;
                    args.hit = local_1918;
                    args.N = 4;
                    local_19d8 = auVar83;
                    args.ray = (RTCRayN *)ray;
                    local_1918 = (RTCHitN  [16])auVar92;
                    local_1908 = auVar93;
                    local_18f8 = auVar40;
                    if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar4->occlusionFilterN)(&args);
                    }
                    if (local_19d8 == (undefined1  [16])0x0) {
                      auVar83 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                      auVar83 = auVar83 ^ _DAT_01febe20;
                    }
                    else {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var5)(&args);
                      }
                      auVar37 = vpcmpeqd_avx((undefined1  [16])0x0,local_19d8);
                      auVar83 = auVar37 ^ _DAT_01febe20;
                      auVar48._8_4_ = 0xff800000;
                      auVar48._0_8_ = 0xff800000ff800000;
                      auVar48._12_4_ = 0xff800000;
                      auVar37 = vblendvps_avx(auVar48,*(undefined1 (*) [16])(args.ray + 0x80),
                                              auVar37);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar37;
                    }
                    auVar37 = vpslld_avx(auVar83,0x1f);
                    auVar83 = vpsrad_avx(auVar37,0x1f);
                    auVar37 = vblendvps_avx(auVar67,*(undefined1 (*) [16])local_19c0,auVar37);
                    *(undefined1 (*) [16])local_19c0 = auVar37;
                  }
                  local_1a28 = vpandn_avx(auVar83,local_1a28);
                  auVar62 = local_19b8;
                }
              }
            }
          }
        }
      }
      if ((((local_1a28 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (local_1a28 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (local_1a28 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          -1 < local_1a28[0xf]) {
        bVar29 = false;
        auVar51 = vpcmpeqd_avx(auVar51,auVar51);
      }
      else {
        auVar9._4_4_ = fStack_1844;
        auVar9._0_4_ = local_1848;
        auVar9._8_4_ = fStack_1840;
        auVar9._12_4_ = fStack_183c;
        auVar12._4_4_ = fStack_1804;
        auVar12._0_4_ = local_1808;
        auVar12._8_4_ = fStack_1800;
        auVar12._12_4_ = fStack_17fc;
        auVar30 = vsubps_avx(auVar9,auVar12);
        auVar11._4_4_ = fStack_1814;
        auVar11._0_4_ = local_1818;
        auVar11._8_4_ = fStack_1810;
        auVar11._12_4_ = fStack_180c;
        auVar67 = vsubps_avx(auVar62,auVar11);
        auVar10._4_4_ = fStack_1824;
        auVar10._0_4_ = local_1828;
        auVar10._8_4_ = fStack_1820;
        auVar10._12_4_ = fStack_181c;
        auVar68 = vsubps_avx(local_1858,auVar10);
        auVar73 = vsubps_avx(_local_1a08,auVar9);
        auVar92 = vsubps_avx(_local_19a8,auVar62);
        auVar13._4_4_ = fStack_17f4;
        auVar13._0_4_ = local_17f8;
        auVar13._8_4_ = fStack_17f0;
        auVar13._12_4_ = fStack_17ec;
        auVar93 = vsubps_avx(auVar13,local_1858);
        auVar55._0_4_ = auVar67._0_4_ * auVar93._0_4_;
        auVar55._4_4_ = auVar67._4_4_ * auVar93._4_4_;
        auVar55._8_4_ = auVar67._8_4_ * auVar93._8_4_;
        auVar55._12_4_ = auVar67._12_4_ * auVar93._12_4_;
        auVar54 = vfmsub231ps_fma(auVar55,auVar92,auVar68);
        auVar47._0_4_ = auVar68._0_4_ * auVar73._0_4_;
        auVar47._4_4_ = auVar68._4_4_ * auVar73._4_4_;
        auVar47._8_4_ = auVar68._8_4_ * auVar73._8_4_;
        auVar47._12_4_ = auVar68._12_4_ * auVar73._12_4_;
        auVar61 = vfmsub231ps_fma(auVar47,auVar93,auVar30);
        auVar41._0_4_ = auVar92._0_4_ * auVar30._0_4_;
        auVar41._4_4_ = auVar92._4_4_ * auVar30._4_4_;
        auVar41._8_4_ = auVar92._8_4_ * auVar30._8_4_;
        auVar41._12_4_ = auVar92._12_4_ * auVar30._12_4_;
        auVar40 = vsubps_avx(auVar9,*(undefined1 (*) [16])ray);
        auVar46 = vsubps_avx(auVar62,*(undefined1 (*) [16])(ray + 0x10));
        auVar74 = vsubps_avx(local_1858,*(undefined1 (*) [16])(ray + 0x20));
        auVar62 = vfmsub231ps_fma(auVar41,auVar73,auVar67);
        auVar51 = *(undefined1 (*) [16])(ray + 0x40);
        auVar83 = *(undefined1 (*) [16])(ray + 0x50);
        auVar108._0_4_ = auVar51._0_4_ * auVar46._0_4_;
        auVar108._4_4_ = auVar51._4_4_ * auVar46._4_4_;
        auVar108._8_4_ = auVar51._8_4_ * auVar46._8_4_;
        auVar108._12_4_ = auVar51._12_4_ * auVar46._12_4_;
        auVar70 = vfmsub231ps_fma(auVar108,auVar40,auVar83);
        auVar37 = *(undefined1 (*) [16])(ray + 0x60);
        auVar86._0_4_ = auVar37._0_4_ * auVar62._0_4_;
        auVar86._4_4_ = auVar37._4_4_ * auVar62._4_4_;
        auVar86._8_4_ = auVar37._8_4_ * auVar62._8_4_;
        auVar86._12_4_ = auVar37._12_4_ * auVar62._12_4_;
        auVar78 = vfmadd231ps_fma(auVar86,auVar61,auVar83);
        auVar110._0_4_ = auVar83._0_4_ * auVar74._0_4_;
        auVar110._4_4_ = auVar83._4_4_ * auVar74._4_4_;
        auVar110._8_4_ = auVar83._8_4_ * auVar74._8_4_;
        auVar110._12_4_ = auVar83._12_4_ * auVar74._12_4_;
        auVar84 = vfmsub231ps_fma(auVar110,auVar46,auVar37);
        auVar112._0_4_ = auVar37._0_4_ * auVar40._0_4_;
        auVar112._4_4_ = auVar37._4_4_ * auVar40._4_4_;
        auVar112._8_4_ = auVar37._8_4_ * auVar40._8_4_;
        auVar112._12_4_ = auVar37._12_4_ * auVar40._12_4_;
        auVar85 = vfmsub231ps_fma(auVar112,auVar74,auVar51);
        auVar78 = vfmadd231ps_fma(auVar78,auVar54,auVar51);
        auVar31._0_4_ = auVar93._0_4_ * auVar70._0_4_;
        auVar31._4_4_ = auVar93._4_4_ * auVar70._4_4_;
        auVar31._8_4_ = auVar93._8_4_ * auVar70._8_4_;
        auVar31._12_4_ = auVar93._12_4_ * auVar70._12_4_;
        auVar83 = vfmadd231ps_fma(auVar31,auVar85,auVar92);
        auVar51 = vandps_avx(auVar78,local_1838);
        auVar83 = vfmadd231ps_fma(auVar83,auVar84,auVar73);
        uVar17 = auVar51._0_4_;
        auVar63._0_4_ = (float)(uVar17 ^ auVar83._0_4_);
        uVar96 = auVar51._4_4_;
        auVar63._4_4_ = (float)(uVar96 ^ auVar83._4_4_);
        uVar99 = auVar51._8_4_;
        auVar63._8_4_ = (float)(uVar99 ^ auVar83._8_4_);
        uVar100 = auVar51._12_4_;
        auVar63._12_4_ = (float)(uVar100 ^ auVar83._12_4_);
        auVar83 = vcmpps_avx(auVar63,_DAT_01feba10,5);
        auVar37 = local_1a28 & auVar83;
        _local_19a8 = auVar67;
        if ((((auVar37 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar37 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar37 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar37[0xf] < '\0') {
          auVar83 = vandps_avx(auVar83,local_1a28);
          auVar32._0_4_ = auVar68._0_4_ * auVar70._0_4_;
          auVar32._4_4_ = auVar68._4_4_ * auVar70._4_4_;
          auVar32._8_4_ = auVar68._8_4_ * auVar70._8_4_;
          auVar32._12_4_ = auVar68._12_4_ * auVar70._12_4_;
          auVar37 = vfmadd213ps_fma(auVar67,auVar85,auVar32);
          auVar37 = vfmadd213ps_fma(auVar30,auVar84,auVar37);
          auVar75._0_4_ = (float)(uVar17 ^ auVar37._0_4_);
          auVar75._4_4_ = (float)(uVar96 ^ auVar37._4_4_);
          auVar75._8_4_ = (float)(uVar99 ^ auVar37._8_4_);
          auVar75._12_4_ = (float)(uVar100 ^ auVar37._12_4_);
          auVar37 = vcmpps_avx(auVar75,_DAT_01feba10,5);
          auVar30 = auVar83 & auVar37;
          if ((((auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar30[0xf] < '\0') {
            auVar30 = vandps_avx(auVar78,auVar102);
            auVar83 = vandps_avx(auVar37,auVar83);
            auVar37 = vsubps_avx(auVar30,auVar63);
            auVar37 = vcmpps_avx(auVar37,auVar75,5);
            auVar67 = auVar83 & auVar37;
            if ((((auVar67 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar67 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar67 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar67[0xf] < '\0') {
              auVar83 = vandps_avx(auVar37,auVar83);
              auVar33._0_4_ = auVar74._0_4_ * auVar62._0_4_;
              auVar33._4_4_ = auVar74._4_4_ * auVar62._4_4_;
              auVar33._8_4_ = auVar74._8_4_ * auVar62._8_4_;
              auVar33._12_4_ = auVar74._12_4_ * auVar62._12_4_;
              auVar37 = vfmadd213ps_fma(auVar46,auVar61,auVar33);
              auVar37 = vfmadd213ps_fma(auVar40,auVar54,auVar37);
              auVar71._0_4_ = (float)(uVar17 ^ auVar37._0_4_);
              auVar71._4_4_ = (float)(uVar96 ^ auVar37._4_4_);
              auVar71._8_4_ = (float)(uVar99 ^ auVar37._8_4_);
              auVar71._12_4_ = (float)(uVar100 ^ auVar37._12_4_);
              auVar34._0_4_ = auVar30._0_4_ * *(float *)(ray + 0x30);
              auVar34._4_4_ = auVar30._4_4_ * *(float *)(ray + 0x34);
              auVar34._8_4_ = auVar30._8_4_ * *(float *)(ray + 0x38);
              auVar34._12_4_ = auVar30._12_4_ * *(float *)(ray + 0x3c);
              auVar37 = vcmpps_avx(auVar34,auVar71,1);
              _local_19a8 = *(undefined1 (*) [16])(ray + 0x80);
              auVar81._0_4_ = auVar30._0_4_ * *(float *)(ray + 0x80);
              auVar81._4_4_ = auVar30._4_4_ * *(float *)(ray + 0x84);
              auVar81._8_4_ = auVar30._8_4_ * *(float *)(ray + 0x88);
              auVar81._12_4_ = auVar30._12_4_ * *(float *)(ray + 0x8c);
              auVar67 = vcmpps_avx(auVar71,auVar81,2);
              auVar37 = vandps_avx(auVar67,auVar37);
              auVar67 = auVar83 & auVar37;
              if ((((auVar67 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar67 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar67 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar67[0xf] < '\0') {
                auVar83 = vandps_avx(auVar83,auVar37);
                auVar37 = vcmpps_avx(auVar78,_DAT_01feba10,4);
                auVar67 = auVar83 & auVar37;
                if ((((auVar67 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar67 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar67 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar67[0xf] < '\0') {
                  auVar83 = vandps_avx(auVar37,auVar83);
                  uVar96 = *(uint *)(lVar27 + -0x10 + uVar21 * 4);
                  pGVar4 = (context->scene->geometries).items[uVar96].ptr;
                  uVar17 = pGVar4->mask;
                  auVar35._4_4_ = uVar17;
                  auVar35._0_4_ = uVar17;
                  auVar35._8_4_ = uVar17;
                  auVar35._12_4_ = uVar17;
                  auVar37 = vpand_avx(auVar35,*(undefined1 (*) [16])(ray + 0x90));
                  auVar37 = vpcmpeqd_avx(auVar37,_DAT_01feba10);
                  auVar67 = auVar83 & ~auVar37;
                  if ((((auVar67 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar67 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar67 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar67[0xf] < '\0') {
                    uVar19 = *(undefined4 *)(lVar27 + uVar21 * 4);
                    auVar83 = vandnps_avx(auVar37,auVar83);
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar37 = vrcpps_avx(auVar30);
                      auVar87._8_4_ = 0x3f800000;
                      auVar87._0_8_ = &DAT_3f8000003f800000;
                      auVar87._12_4_ = 0x3f800000;
                      auVar30 = vfnmadd213ps_fma(auVar30,auVar37,auVar87);
                      auVar37 = vfmadd132ps_fma(auVar30,auVar37,auVar37);
                      fVar52 = auVar37._0_4_;
                      auVar36._0_4_ = fVar52 * auVar63._0_4_;
                      fVar57 = auVar37._4_4_;
                      auVar36._4_4_ = fVar57 * auVar63._4_4_;
                      fVar58 = auVar37._8_4_;
                      auVar36._8_4_ = fVar58 * auVar63._8_4_;
                      fVar59 = auVar37._12_4_;
                      auVar36._12_4_ = fVar59 * auVar63._12_4_;
                      auVar37 = vminps_avx(auVar36,auVar87);
                      auVar66._0_4_ = fVar52 * auVar75._0_4_;
                      auVar66._4_4_ = fVar57 * auVar75._4_4_;
                      auVar66._8_4_ = fVar58 * auVar75._8_4_;
                      auVar66._12_4_ = fVar59 * auVar75._12_4_;
                      auVar30 = vminps_avx(auVar66,auVar87);
                      auVar67 = vsubps_avx(auVar87,auVar37);
                      auVar68 = vsubps_avx(auVar87,auVar30);
                      local_18e8 = vblendvps_avx(auVar37,auVar67,local_1888);
                      local_18d8 = vblendvps_avx(auVar30,auVar68,local_1888);
                      local_18b8._4_4_ = uVar96;
                      local_18b8._0_4_ = uVar96;
                      local_18b8._8_4_ = uVar96;
                      local_18b8._12_4_ = uVar96;
                      local_18c8._4_4_ = uVar19;
                      local_18c8._0_4_ = uVar19;
                      local_18c8._8_4_ = uVar19;
                      local_18c8._12_4_ = uVar19;
                      vpcmpeqd_avx2(ZEXT1632(local_18e8),ZEXT1632(local_18e8));
                      uStack_18a4 = context->user->instID[0];
                      local_18a8 = uStack_18a4;
                      uStack_18a0 = uStack_18a4;
                      uStack_189c = uStack_18a4;
                      uStack_1898 = context->user->instPrimID[0];
                      auVar43._0_4_ = fVar52 * auVar71._0_4_;
                      auVar43._4_4_ = fVar57 * auVar71._4_4_;
                      auVar43._8_4_ = fVar58 * auVar71._8_4_;
                      auVar43._12_4_ = fVar59 * auVar71._12_4_;
                      uStack_1894 = uStack_1898;
                      uStack_1890 = uStack_1898;
                      uStack_188c = uStack_1898;
                      auVar37 = vblendvps_avx(_local_19a8,auVar43,auVar83);
                      *(undefined1 (*) [16])(ray + 0x80) = auVar37;
                      args.valid = (int *)local_19d8;
                      args.geometryUserPtr = pGVar4->userPtr;
                      args.context = context->user;
                      args.hit = local_1918;
                      args.N = 4;
                      local_19d8 = auVar83;
                      args.ray = (RTCRayN *)ray;
                      local_1918 = (RTCHitN  [16])auVar54;
                      local_1908 = auVar61;
                      local_18f8 = auVar62;
                      if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar4->occlusionFilterN)(&args);
                      }
                      if (local_19d8 == (undefined1  [16])0x0) {
                        auVar83 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                        auVar83 = auVar83 ^ _DAT_01febe20;
                      }
                      else {
                        p_Var5 = context->args->filter;
                        if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var5)(&args);
                        }
                        auVar37 = vpcmpeqd_avx((undefined1  [16])0x0,local_19d8);
                        auVar83 = auVar37 ^ _DAT_01febe20;
                        auVar49._8_4_ = 0xff800000;
                        auVar49._0_8_ = 0xff800000ff800000;
                        auVar49._12_4_ = 0xff800000;
                        auVar37 = vblendvps_avx(auVar49,*(undefined1 (*) [16])(args.ray + 0x80),
                                                auVar37);
                        *(undefined1 (*) [16])(args.ray + 0x80) = auVar37;
                      }
                      auVar37 = vpslld_avx(auVar83,0x1f);
                      auVar83 = vpsrad_avx(auVar37,0x1f);
                      auVar37 = vblendvps_avx(_local_19a8,*(undefined1 (*) [16])local_19c0,auVar37);
                      *(undefined1 (*) [16])local_19c0 = auVar37;
                    }
                    local_1a28 = vpandn_avx(auVar83,local_1a28);
                  }
                }
              }
            }
          }
        }
        bVar29 = (((local_1a28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                  (local_1a28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (local_1a28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 local_1a28[0xf] < '\0';
        auVar51 = vpcmpeqd_avx(auVar51,auVar51);
      }
      auVar98 = ZEXT1664(auVar51);
      auVar95 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      if ((!bVar29) || (bVar29 = 2 < uVar21, uVar21 = uVar21 + 1, bVar29)) break;
    }
    auVar51 = vandps_avx(local_1a28,auVar53);
    auVar53 = auVar53 & local_1a28;
    if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar53 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar53 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar53[0xf])
    break;
  }
  aVar38._0_4_ = auVar98._0_4_ ^ auVar51._0_4_;
  aVar38._4_4_ = auVar98._4_4_ ^ auVar51._4_4_;
  aVar38._8_4_ = auVar98._8_4_ ^ auVar51._8_4_;
  aVar38._12_4_ = auVar98._12_4_ ^ auVar51._12_4_;
LAB_005430b7:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx((undefined1  [16])aVar38,(undefined1  [16])terminated.field_0);
  auVar53 = auVar98._0_16_ & ~(undefined1  [16])terminated.field_0;
  if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar53 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar53 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar53[0xf]) {
LAB_005430fa:
    iVar18 = 3;
  }
  else {
    auVar50._8_4_ = 0xff800000;
    auVar50._0_8_ = 0xff800000ff800000;
    auVar50._12_4_ = 0xff800000;
    tray.tfar.field_0 =
         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
         vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar50,
                       (undefined1  [16])terminated.field_0);
    iVar18 = 0;
  }
LAB_005430fd:
  if (iVar18 == 3) {
    auVar53 = vandps_avx(local_1868,(undefined1  [16])terminated.field_0);
    auVar44._8_4_ = 0xff800000;
    auVar44._0_8_ = 0xff800000ff800000;
    auVar44._12_4_ = 0xff800000;
    auVar53 = vmaskmovps_avx(auVar53,auVar44);
    *(undefined1 (*) [16])local_19c0 = auVar53;
    return;
  }
  goto LAB_005423d4;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }